

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O0

void __thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
GenericValue(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *this,Ch *s,SizeType length)

{
  StringRefType local_30;
  SizeType local_1c;
  Ch *pCStack_18;
  SizeType length_local;
  Ch *s_local;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_local;
  
  this->data_ = (Data)0x0;
  local_1c = length;
  pCStack_18 = s;
  s_local = (Ch *)this;
  StringRef<char>((rapidjson *)&local_30,s,(ulong)length);
  SetStringRaw(this,&local_30);
  return;
}

Assistant:

GenericValue(const Ch* s, SizeType length) RAPIDJSON_NOEXCEPT : data_() { SetStringRaw(StringRef(s, length)); }